

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract
               (data_view *data,DataType baseType,vector<double,_std::allocator<double>_> *val)

{
  long lVar1;
  uint *puVar2;
  data_view *data_00;
  complex<double> *cval;
  _Uninitialized<double,_true> __z;
  double in_XMM1_Qa;
  basic_string_view<char,_std::char_traits<char>_> val_00;
  string_view val_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  undefined1 local_70 [48];
  _Uninitialized<double,_true> local_40;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar2 = &switchD_00238951::switchdataD_0039d79c;
  switch(baseType) {
  case HELICS_DOUBLE:
    local_70._0_8_ = ValueConverter<double>::interpret(data);
    break;
  case HELICS_INT:
    lVar1 = ValueConverter<long>::interpret(data);
    local_70._0_8_ = (undefined8)lVar1;
    break;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    local_40._M_storage = in_XMM1_Qa;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)local_70);
    local_70._0_8_ = local_40._M_storage;
    if ((local_40._M_storage == 0.0) && (!NAN(local_40._M_storage))) {
      return;
    }
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret(data,val);
    return;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_70,data)
    ;
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(local_70._8_8_ - local_70._0_8_) >> 4);
    for (__z._M_storage = (double)local_70._0_8_; __z._M_storage != (double)local_70._8_8_;
        __z._M_storage = __z._M_storage + 0x10) {
      if ((*(double *)((long)__z._M_storage + 8) != 0.0) ||
         (NAN(*(double *)((long)__z._M_storage + 8)))) {
        local_38._M_impl.super__Vector_impl_data._M_start =
             (pointer)std::abs<double>((complex<double> *)__z._M_storage);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)&local_38);
      }
      else {
        local_38._M_impl.super__Vector_impl_data._M_start = *(pointer *)__z._M_storage;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)&local_38);
      }
    }
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               local_70);
    return;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_70,data);
    if (NAN((double)local_70._32_8_)) {
      val_01._M_str = (char *)puVar2;
      val_01._M_len = local_70._0_8_;
      helicsGetVector((vector<double,_std::allocator<double>_> *)&local_38,(helics *)local_70._8_8_,
                      val_01);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(val,&local_38);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    }
    else {
      std::vector<double,_std::allocator<double>_>::push_back
                (val,(value_type_conflict6 *)(local_70 + 0x20));
    }
    std::__cxx11::string::~string((string *)local_70);
    return;
  case HELICS_TIME:
    lVar1 = ValueConverter<long>::interpret(data);
    local_70._0_8_ = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
    break;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_70,(helics *)data,data_00);
      valueExtract((defV *)local_70,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_70);
      return;
    }
  case HELICS_BOOL:
    val_00 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data)
    ;
    helicsGetVector(val_00,val);
    return;
  }
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)local_70);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<double>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.push_back(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT: {
            val.push_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)));
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.push_back(static_cast<double>(time));
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetVector(npval.name);
            } else {
                val.push_back(npval.value);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            ValueConverter<std::vector<double>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val.reserve(cvec.size());
            for (auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}